

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud.cc
# Opt level: O1

PointAttribute * __thiscall
draco::PointCloud::GetAttributeByUniqueId(PointCloud *this,uint32_t unique_id)

{
  pointer puVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  puVar1 = (this->attributes_).
           super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar2 = -1;
  lVar3 = (long)(this->attributes_).
                super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1;
  if (lVar3 != 0) {
    lVar3 = lVar3 >> 3;
    lVar4 = 0;
    do {
      if (*(uint32_t *)
           ((long)puVar1[lVar4]._M_t.
                  super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                  ._M_t + 0x3c) == unique_id) {
        iVar2 = (int)lVar4;
        break;
      }
      lVar4 = lVar4 + 1;
    } while (lVar3 + (ulong)(lVar3 == 0) != lVar4);
  }
  if (iVar2 == -1) {
    return (PointAttribute *)0x0;
  }
  return (PointAttribute *)
         ((_Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>)
         puVar1[iVar2]._M_t.
         super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>.
         _M_t).
         super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
  ;
}

Assistant:

const PointAttribute *PointCloud::GetAttributeByUniqueId(
    uint32_t unique_id) const {
  const int32_t att_id = GetAttributeIdByUniqueId(unique_id);
  if (att_id == -1) {
    return nullptr;
  }
  return attributes_[att_id].get();
}